

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O2

Vec_Int_t * Fra_ClauSaveOutputVars(Aig_Man_t *pMan,Cnf_Dat_t *pCnf)

{
  Vec_Int_t *p;
  void *pvVar1;
  int i;
  
  p = Vec_IntAlloc(pMan->nObjs[3]);
  for (i = 0; i < pMan->vCos->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(pMan->vCos,i);
    Vec_IntPush(p,pCnf->pVarNums[*(int *)((long)pvVar1 + 0x24)]);
  }
  return p;
}

Assistant:

Vec_Int_t * Fra_ClauSaveOutputVars( Aig_Man_t * pMan, Cnf_Dat_t * pCnf )
{
    Vec_Int_t * vVars;
    Aig_Obj_t * pObj;
    int i;
    vVars = Vec_IntAlloc( Aig_ManCoNum(pMan) );
    Aig_ManForEachCo( pMan, pObj, i )
        Vec_IntPush( vVars, pCnf->pVarNums[pObj->Id] );
    return vVars;
}